

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::decode4
          (Predecoder<(InstructionSet::M68k::Model)1> *this,uint16_t instruction)

{
  uint uVar1;
  Preinstruction PVar2;
  Preinstruction PVar4;
  Preinstruction PVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Preinstruction PVar3;
  
  uVar7 = (uint)instruction;
  uVar1 = (uVar7 & 0xfff) - 0xe70;
  if ((uVar1 < 0xc) && ((0xcffU >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar6 = (ulong)uVar1;
    uVar1 = *(uint *)(&DAT_0043f134 + uVar6 * 4);
    uVar8 = *(uint *)(&DAT_0043f164 + uVar6 * 4);
    PVar5.operands_[0] = '\0';
    PVar5.operands_[1] = '\0';
    PVar5.flags_ = '\0';
    PVar5.operation = (&DAT_0043f194)[uVar6 * 4];
    PVar4.operation = Undefined;
    PVar4.operands_[0] = '\0';
    PVar4.operands_[1] = 'h';
    PVar4.flags_ = '\0';
    goto LAB_001c6491;
  }
  uVar9 = uVar7 & 0xff8;
  PVar3.operation = Undefined;
  PVar3.operands_[0] = '\0';
  PVar3.operands_[1] = 'h';
  PVar3.flags_ = '\0';
  PVar4.operation = Undefined;
  PVar4.operands_[0] = '\0';
  PVar4.operands_[1] = 'h';
  PVar4.flags_ = '\0';
  PVar2.operation = Undefined;
  PVar2.operands_[0] = '\0';
  PVar2.operands_[1] = 'h';
  PVar2.flags_ = '\0';
  if (uVar9 == 0xe68) {
    PVar5.operation = MOVEfromUSP;
    PVar5.operands_[0] = '\0';
    PVar5.operands_[1] = '\0';
    PVar5.flags_ = '\0';
LAB_001c6489:
    uVar8 = uVar7 & 7 | 8;
    uVar1 = 0x82000000;
    goto LAB_001c6491;
  }
  uVar8 = 0x70;
  uVar1 = 0;
  if (uVar9 == 0x848) {
    PVar5.operation = BKPT;
    PVar5.operands_[0] = '\0';
    PVar5.operands_[1] = '\0';
    PVar5.flags_ = '\0';
    PVar4 = PVar2;
    goto LAB_001c6491;
  }
  if (uVar9 == 0x880) {
    uVar8 = uVar7 & 7;
    PVar5.operation = EXTbtow;
    PVar5.operands_[0] = '\0';
    PVar5.operands_[1] = '\0';
    PVar5.flags_ = '\0';
    PVar4 = PVar3;
LAB_001c647a:
    uVar1 = 0x1000000;
  }
  else {
    if (uVar9 == 0x8c0) {
      uVar8 = uVar7 & 7;
      PVar5.operation = EXTwtol;
      PVar5.operands_[0] = '\0';
      PVar5.operands_[1] = '\0';
      PVar5.flags_ = '\0';
    }
    else {
      if (uVar9 == 0xe50) {
        uVar8 = uVar7 & 7 | 8;
        PVar5.operation = LINKw;
        PVar5.operands_[0] = '\0';
        PVar5.operands_[1] = '\0';
        PVar5.flags_ = '\0';
        PVar4.operation = Undefined;
        PVar4.operands_[0] = '\0';
        PVar4.operands_[1] = '`';
        PVar4.flags_ = '\0';
        goto LAB_001c647a;
      }
      if (uVar9 == 0xe58) {
        uVar8 = uVar7 & 7 | 8;
        PVar5.operation = UNLINK;
        PVar5.operands_[0] = '\0';
        PVar5.operands_[1] = '\0';
        PVar5.flags_ = '\0';
      }
      else {
        if (uVar9 == 0xe60) {
          PVar5.operation = MOVEtoUSP;
          PVar5.operands_[0] = '\0';
          PVar5.operands_[1] = '\0';
          PVar5.flags_ = '\0';
          goto LAB_001c6489;
        }
        if (uVar9 != 0x840) {
          if ((uVar7 & 0xff0) == 0xe40) {
            PVar5.operation = TRAP;
            PVar5.operands_[0] = '\0';
            PVar5.operands_[1] = '\0';
            PVar5.flags_ = '\0';
            PVar4 = PVar2;
          }
          else {
            switch(instruction >> 6 & 0x3f) {
            case 0:
              PVar5 = decode<(unsigned_char)63,true>(this,instruction);
              break;
            case 1:
              PVar5 = decode<(unsigned_char)64,true>(this,instruction);
              break;
            case 2:
              PVar5 = decode<(unsigned_char)65,true>(this,instruction);
              break;
            case 3:
              PVar5 = decode<(unsigned_char)29,true>(this,instruction);
              break;
            default:
              if ((uVar7 & 0x1c0) == 0x180) {
                PVar5 = decode<(unsigned_char)127,true>(this,instruction);
              }
              else {
                if ((uVar7 & 0x1c0) != 0x1c0) {
                  uVar8 = 0xd;
                  PVar4.operation = Undefined;
                  PVar4.operands_[0] = '\0';
                  PVar4.operands_[1] = '\r';
                  PVar4.flags_ = '\0';
                  uVar1 = 0;
                  PVar5.operation = Undefined;
                  PVar5.operands_[0] = '\0';
                  PVar5.operands_[1] = '\0';
                  PVar5.flags_ = '\0';
                  goto LAB_001c6491;
                }
                PVar5 = decode<(unsigned_char)26,true>(this,instruction);
              }
              break;
            case 8:
              PVar5 = decode<(unsigned_char)60,true>(this,instruction);
              break;
            case 9:
              PVar5 = decode<(unsigned_char)61,true>(this,instruction);
              break;
            case 10:
              PVar5 = decode<(unsigned_char)62,true>(this,instruction);
              break;
            case 0xb:
              PVar5 = decode<(unsigned_char)137,true>(this,instruction);
              break;
            case 0x10:
              PVar5 = decode<(unsigned_char)66,true>(this,instruction);
              break;
            case 0x11:
              PVar5 = decode<(unsigned_char)67,true>(this,instruction);
              break;
            case 0x12:
              PVar5 = decode<(unsigned_char)68,true>(this,instruction);
              break;
            case 0x13:
              PVar5 = decode<(unsigned_char)30,true>(this,instruction);
              break;
            case 0x18:
              PVar5 = decode<(unsigned_char)113,true>(this,instruction);
              break;
            case 0x19:
              PVar5 = decode<(unsigned_char)114,true>(this,instruction);
              break;
            case 0x1a:
              PVar5 = decode<(unsigned_char)115,true>(this,instruction);
              break;
            case 0x1b:
              PVar5 = decode<(unsigned_char)28,true>(this,instruction);
              break;
            case 0x20:
              PVar5 = decode<(unsigned_char)4,true>(this,instruction);
              break;
            case 0x21:
              PVar5 = decode<(unsigned_char)27,true>(this,instruction);
              break;
            case 0x22:
              PVar5 = decode<(unsigned_char)104,true>(this,instruction);
              break;
            case 0x23:
              PVar5 = decode<(unsigned_char)103,true>(this,instruction);
              break;
            case 0x28:
              PVar5 = decode<(unsigned_char)48,true>(this,instruction);
              break;
            case 0x29:
              PVar5 = decode<(unsigned_char)49,true>(this,instruction);
              break;
            case 0x2a:
              PVar5 = decode<(unsigned_char)50,true>(this,instruction);
              break;
            case 0x2b:
              PVar5 = decode<(unsigned_char)130,true>(this,instruction);
              break;
            case 0x32:
              PVar5 = decode<(unsigned_char)102,true>(this,instruction);
              break;
            case 0x33:
              PVar5 = decode<(unsigned_char)101,true>(this,instruction);
              break;
            case 0x3a:
              PVar5 = decode<(unsigned_char)52,true>(this,instruction);
              break;
            case 0x3b:
              PVar5 = decode<(unsigned_char)51,true>(this,instruction);
            }
            uVar8 = (uint)PVar5 >> 8;
            uVar1 = (uint)PVar5 & 0xff000000;
            PVar4 = PVar5;
          }
          goto LAB_001c6491;
        }
        uVar8 = uVar7 & 7;
        PVar5.operation = SWAP;
        PVar5.operands_[0] = '\0';
        PVar5.operands_[1] = '\0';
        PVar5.flags_ = '\0';
      }
    }
    uVar1 = 0x2000000;
  }
LAB_001c6491:
  return (Preinstruction)((uint)PVar5 & 0xff | (uint)PVar4 & 0xff0000 | uVar1 | (uVar8 & 0xff) << 8)
  ;
}

Assistant:

Preinstruction Predecoder<model>::decode4(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0xfff) {
		case 0xe70:	Decode(Op::RESET);	// 6-83 (p537)
		case 0xe71:	Decode(Op::NOP);	// 4-147 (p251)
		case 0xe72:	Decode(Op::STOP);	// 6-85 (p539)
		case 0xe73:	Decode(Op::RTE);	// 6-84 (p538)
		case 0xe74:	DecodeReq(model >= Model::M68010, Op::RTD);		// 4-166 (p270)
		case 0xe75:	Decode(Op::RTS);	// 4-169 (p273)
		case 0xe76:	Decode(Op::TRAPV);	// 4-191 (p295)
		case 0xe77:	Decode(Op::RTR);	// 4-168 (p272)
		case 0xe7a: DecodeReq(model >= Model::M68010, Op::MOVEtoC);		// 6-22 (p476)
		case 0xe7b: DecodeReq(model >= Model::M68010, Op::MOVEfromC);	// 6-22 (p476)
		default:	break;
	}

	switch(instruction & 0xff8) {
		case 0x840:	Decode(Op::SWAP);			// 4-185 (p289)
		case 0x848: DecodeReq(model >= Model::M68010, Op::BKPT);	// 4-54 (p158)
		case 0xe58:	Decode(Op::UNLINK);			// 4-194 (p298)
		case 0xe60:	Decode(Op::MOVEtoUSP);		// 6-21 (p475)
		case 0xe68:	Decode(Op::MOVEfromUSP);	// 6-21 (p475)

		// 4-106 (p210)
		case 0x880:	Decode(Op::EXTbtow);
		case 0x8c0:	Decode(Op::EXTwtol);
		case 0x9c0:	DecodeReq(model >= Model::M68020, Op::EXTbtol);

		// 4-111 (p215)
		case 0x808:	DecodeReq(model >= Model::M68020, Op::LINKl);
		case 0xe50:	Decode(Op::LINKw);

		default:	break;
	}

	switch(instruction & 0xff0) {
		case 0xe40:	Decode(Op::TRAP);		// 4-188 (p292)
		default:	break;
	}

	switch(instruction & 0xfc0) {
		// 4-146 (p250)
		case 0x000:	Decode(Op::NEGXb);
		case 0x040:	Decode(Op::NEGXw);
		case 0x080:	Decode(Op::NEGXl);

		// 6-17 (p471)
		case 0x0c0:	Decode(Op::MOVEfromSR);

		// 4-73 (p177)
		case 0x200:	Decode(Op::CLRb);
		case 0x240:	Decode(Op::CLRw);
		case 0x280:	Decode(Op::CLRl);

		// 4-144 (p247)
		case 0x400:	Decode(Op::NEGb);
		case 0x440:	Decode(Op::NEGw);
		case 0x480:	Decode(Op::NEGl);

		// 4-123 (p227)
		case 0x4c0:	Decode(Op::MOVEtoCCR);

		// 4-148 (p252)
		case 0x600:	Decode(Op::NOTb);
		case 0x640:	Decode(Op::NOTw);
		case 0x680:	Decode(Op::NOTl);

		// 4-123 (p227)
		case 0x6c0:	Decode(Op::MOVEtoSR);

		// 4-142 (p246)
		case 0x800:	Decode(Op::NBCD);

		// 4-159 (p263)
		case 0x840:	Decode(Op::PEA);

		// 4-128 (p232)
		case 0x880:	Decode(Op::MOVEMtoMw);
		case 0x8c0:	Decode(Op::MOVEMtoMl);
		case 0xc80:	Decode(Op::MOVEMtoRw);
		case 0xcc0:	Decode(Op::MOVEMtoRl);

		// 4-192 (p296)
		case 0xa00:	Decode(Op::TSTb);
		case 0xa40:	Decode(Op::TSTw);
		case 0xa80:	Decode(Op::TSTl);

		// 4-186 (p290)
		case 0xac0:	Decode(Op::TAS);

		// 4-109 (p213)
		case 0xe80:	Decode(Op::JSR);

		// 4-108 (p212)
		case 0xec0:	Decode(Op::JMP);

		// 4-94 (p198) [DIVS.l]; 4-98 (p202) [DIVU.l]
		case 0xc40:	DecodeReq(model >= Model::M68020, Op::DIVSorDIVUl);

		// 4-137 (p241) [MULS.l]; 4-140 (p244) [MULU.l]
		case 0xc00:	DecodeReq(model >= Model::M68020, Op::MULSorMULUl);

		// 4-121 (p225)
		case 0x2c0: DecodeReq(model >= Model::M68010, Op::MOVEfromCCR);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		case 0x1c0:	Decode(Op::LEA);	// 4-110 (p214)

		// 4-69 (p173)
		case 0x180:	Decode(Op::CHKw);
		case 0x100:	DecodeReq(model >= Model::M68020, Op::CHKl);

		default:	break;
	}

	return Preinstruction();
}